

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

Time __thiscall helics::apps::Player::extractTime(Player *this,string_view str,int lineNumber)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  string_view timeString;
  allocator<char> local_49;
  string_view str_local;
  string local_38;
  
  str_local._M_str = str._M_str;
  str_local._M_len = str._M_len;
  if (this->units == ns) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_38,&str_local,&local_49);
    TVar1.internalTimeCode = CLI::std::__cxx11::stoll(&local_38,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    timeString._M_str._0_4_ = this->units;
    timeString._M_len = (size_t)str_local._M_str;
    timeString._M_str._4_4_ = 0;
    TVar1 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      ((utilities *)str_local._M_len,timeString,lineNumber);
  }
  return (Time)TVar1.internalTimeCode;
}

Assistant:

helics::Time Player::extractTime(std::string_view str, int lineNumber) const
{
    try {
        if (units == time_units::ns)  // ns
        {
            return {std::stoll(std::string(str)), time_units::ns};
        }
        return loadTimeFromString(str, units);
    }
    catch (const std::invalid_argument&) {
        std::cerr << "ill formed time on line " << lineNumber << '\n';
        return helics::Time::minVal();
    }
}